

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O2

void queries::API::GetObjects
               (KEY_ID s,KEY_ID p,
               unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               *results,unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                        *prov)

{
  TYPE_ID s_00;
  Molecule *this;
  undefined1 local_68 [8];
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  tripleTemplates;
  
  this = Molecules::Get((Molecules *)diplo::M,s);
  local_68 = (undefined1  [8])&tripleTemplates._M_h._M_rehash_policy._M_next_resize;
  tripleTemplates._M_h._M_buckets = (__buckets_ptr)0x1;
  tripleTemplates._M_h._M_bucket_count = 0;
  tripleTemplates._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  tripleTemplates._M_h._M_element_count._0_4_ = 0x3f800000;
  tripleTemplates._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  tripleTemplates._M_h._M_rehash_policy._4_4_ = 0;
  tripleTemplates._M_h._M_rehash_policy._M_next_resize = 0;
  if (this != (Molecule *)0x0) {
    s_00 = KeyManager::GetType(s);
    TemplateManager::GetTemplates
              ((TemplateManager *)diplo::TM,s_00,p,0xffffffff,0,
               (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                *)local_68);
    Molecule::GetEntity(this,(unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                              *)local_68,s,0,results,prov);
  }
  std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_68);
  return;
}

Assistant:

void API::GetObjects(KEY_ID s, KEY_ID p, unordered_set<KEY_ID> &results, unordered_set<KEY_ID> &prov) {
    Molecule *m = diplo::M.Get(s);
    unordered_set<size_t> tripleTemplates;
    if (m) {
        diplo::TM.GetTemplates(diplo::KM.GetType(s), p, -1, 0, &tripleTemplates);
//		unordered_set<KEY_ID> result4Geo;
//		unordered_set<diplo::TripleIDs> prov;
        m->GetEntity(&tripleTemplates,s,0,&results, &prov);
//		results.insert(unordered_multimap<KEY_ID, diplo::TripleIDs>());
//		cout << "city:\t" << diplo::KM.Get(s) << "\t" << diplo::KM.GetType(s);
//		cerr << "\tOK\t" << results.size() << endl;
//		for (unordered_set<KEY_ID>::iterator it = results.begin(); it != results.end(); it++) {
//			cout << "\t\t---> " << diplo::KM.Get(*it) << endl;
//		}
    }
}